

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadOpCode(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             *this)

{
  uint uVar1;
  ulong local_38 [3];
  ArgList local_20;
  
  uVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
  if (0x52 < (int)uVar1) {
    local_38[0] = (ulong)uVar1;
    local_20.types_ = 2;
    local_20.field_1.values_ = (Value *)local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x1725a8,&local_20);
  }
  return uVar1;
}

Assistant:

int ReadOpCode() {
    int opcode = reader_.ReadUInt();
    if (opcode > internal::MAX_OPCODE)
      reader_.ReportError("invalid opcode {}", opcode);
    reader_.ReadTillEndOfLine();
    return opcode;
  }